

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpElementRootCP<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCode op,OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  PropertyId propertyId_00;
  ScriptContext *this;
  PropertyRecord *this_00;
  char16 *pcVar4;
  undefined4 *puVar5;
  PropertyRecord *pPropertyName;
  PropertyId propertyId;
  ScriptContext *scriptContext;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data_local;
  OpCode op_local;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId_00 = FunctionBody::GetPropertyIdFromCacheId(dumpFunction,data->inlineCacheIndex);
  this_00 = ScriptContext::GetPropertyName(this,propertyId_00);
  if ((op == InitRootLetFld) || (op == InitRootConstFld)) goto LAB_00b21e30;
  if (op == LdRootFld) {
LAB_00b21dfd:
    uVar1 = data->Value;
    pcVar4 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" R%d = root.%s #%d",(ulong)uVar1,pcVar4,(ulong)data->inlineCacheIndex);
  }
  else {
    if (op != ProfiledLdRootFld) {
      if (op == LdRootMethodFld) goto LAB_00b21dfd;
      if (op != ProfiledLdRootMethodFld) {
        if (op == StRootFld) {
LAB_00b21e30:
          pcVar4 = PropertyRecord::GetBuffer(this_00);
          Output::Print(L" root.%s = R%d #%d",pcVar4,(ulong)data->Value,
                        (ulong)data->inlineCacheIndex);
          return;
        }
        if (op == ProfiledStRootFld) {
LAB_00b21e9b:
          pcVar4 = PropertyRecord::GetBuffer(this_00);
          Output::Print(L" root.%s = R%d #%d",pcVar4,(ulong)data->Value,
                        (ulong)data->inlineCacheIndex);
          DumpProfileId(data->inlineCacheIndex);
          return;
        }
        if (op == StRootFldStrict) goto LAB_00b21e30;
        if (op == ProfiledStRootFldStrict) goto LAB_00b21e9b;
        if (op == InitRootFld) goto LAB_00b21e30;
        if (op == ProfiledInitRootFld) goto LAB_00b21e9b;
        if (op == LdRootFldForTypeOf) goto LAB_00b21dfd;
        if (op != ProfiledLdRootFldForTypeOf) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                      ,0x487,"(false)","Unknown OpCode for OpLayoutElementRootCP");
          if (bVar3) {
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
            return;
          }
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
      }
    }
    uVar1 = data->Value;
    pcVar4 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" R%d = root.%s #%d",(ulong)uVar1,pcVar4,(ulong)data->inlineCacheIndex);
    DumpProfileId(data->inlineCacheIndex);
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpElementRootCP(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyId propertyId = dumpFunction->GetPropertyIdFromCacheId(data->inlineCacheIndex);
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(propertyId);
        switch (op)
        {
            case OpCode::LdRootFld:
            case OpCode::LdRootMethodFld:
            case OpCode::LdRootFldForTypeOf:
            {
                Output::Print(_u(" R%d = root.%s #%d"), data->Value,
                        pPropertyName->GetBuffer(), data->inlineCacheIndex);
                break;
            }
            case OpCode::InitRootFld:
            case OpCode::InitRootLetFld:
            case OpCode::InitRootConstFld:
            case OpCode::StRootFld:
            case OpCode::StRootFldStrict:
            {
                Output::Print(_u(" root.%s = R%d #%d"), pPropertyName->GetBuffer(),
                        data->Value, data->inlineCacheIndex);
                break;
            }
            case OpCode::ProfiledLdRootFld:
            case OpCode::ProfiledLdRootFldForTypeOf:
            case OpCode::ProfiledLdRootMethodFld:
            {
                Output::Print(_u(" R%d = root.%s #%d"), data->Value,
                        pPropertyName->GetBuffer(), data->inlineCacheIndex);
                DumpProfileId(data->inlineCacheIndex);
                break;
            }
            case OpCode::ProfiledInitRootFld:
            case OpCode::ProfiledStRootFld:
            case OpCode::ProfiledStRootFldStrict:
            {
                Output::Print(_u(" root.%s = R%d #%d"), pPropertyName->GetBuffer(),
                        data->Value, data->inlineCacheIndex);
                DumpProfileId(data->inlineCacheIndex);
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementRootCP");
                break;
            }
        }
    }